

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

_Bool upb_Map_Next(upb_Map *map,upb_MessageValue *key,upb_MessageValue *val,size_t *iter)

{
  double dVar1;
  _Bool _Var2;
  upb_StringView *strp;
  size_t __n;
  upb_Array *__src;
  upb_StringView strkey;
  upb_value v;
  upb_Array local_38;
  
  __src = &local_38;
  if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
    _Var2 = upb_strtable_next2(&(map->t).strtable,(upb_StringView *)&local_38,
                               (upb_value *)&local_38.capacity_dont_copy_me__upb_internal_use_only,
                               (intptr_t *)iter);
    if (!_Var2) goto LAB_00306291;
    __n = (size_t)map->key_size;
    __src = (upb_Array *)local_38.data_dont_copy_me__upb_internal_use_only;
    if (__n == 0) {
      key->array_val = (upb_Array *)local_38.data_dont_copy_me__upb_internal_use_only;
      (key->str_val).size = local_38.size_dont_copy_me__upb_internal_use_only;
      goto LAB_00306291;
    }
  }
  else {
    _Var2 = upb_inttable_next(&(map->t).inttable,&local_38.data_dont_copy_me__upb_internal_use_only,
                              (upb_value *)&local_38.capacity_dont_copy_me__upb_internal_use_only,
                              (intptr_t *)iter);
    if (!_Var2) goto LAB_00306291;
    __n = (size_t)map->key_size;
  }
  memcpy(key,__src,__n);
LAB_00306291:
  if (_Var2 != false) {
    local_38.data_dont_copy_me__upb_internal_use_only =
         local_38.capacity_dont_copy_me__upb_internal_use_only;
    if ((long)map->val_size == 0) {
      dVar1 = *(double *)(local_38.capacity_dont_copy_me__upb_internal_use_only + 8);
      val->double_val = *(double *)local_38.capacity_dont_copy_me__upb_internal_use_only;
      (val->str_val).size = (size_t)dVar1;
    }
    else {
      memcpy(val,&local_38,(long)map->val_size);
    }
  }
  return _Var2;
}

Assistant:

bool upb_Map_Next(const upb_Map* map, upb_MessageValue* key,
                  upb_MessageValue* val, size_t* iter) {
  upb_value v;
  bool ret;
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_StringView strkey;
    ret = upb_strtable_next2(&map->t.strtable, &strkey, &v, (intptr_t*)iter);
    if (ret) {
      _upb_map_fromkey(strkey, key, map->key_size);
    }
  } else {
    uintptr_t intkey;
    ret = upb_inttable_next(&map->t.inttable, &intkey, &v, (intptr_t*)iter);
    if (ret) {
      memcpy(key, &intkey, map->key_size);
    }
  }
  if (ret) {
    _upb_map_fromvalue(v, val, map->val_size);
  }
  return ret;
}